

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

void __thiscall
embree::ThinDielectricMaterial::ThinDielectricMaterial
          (ThinDielectricMaterial *this,Vec3fa *transmission,float eta,float thickness)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  SceneGraph::Node::Node((Node *)this,&local_40);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002cc7f0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002cc050;
  (this->base).type = 1;
  uVar1 = *(undefined8 *)((long)&transmission->field_0 + 8);
  *(undefined8 *)&(this->transmission).field_0 = *(undefined8 *)&transmission->field_0;
  *(undefined8 *)((long)&(this->transmission).field_0 + 8) = uVar1;
  fVar2 = logf((transmission->field_0).m128[0]);
  fVar3 = logf((transmission->field_0).m128[1]);
  fVar4 = logf((transmission->field_0).m128[2]);
  (this->transmissionFactor).field_0.m128[0] = thickness * fVar2;
  (this->transmissionFactor).field_0.m128[1] = thickness * fVar3;
  (this->transmissionFactor).field_0.m128[2] = thickness * fVar4;
  (this->transmissionFactor).field_0.m128[3] = thickness * 0.0;
  this->eta = eta;
  this->thickness = thickness;
  return;
}

Assistant:

ThinDielectricMaterial (const Vec3fa& transmission, const float eta, const float thickness)
      : base(MATERIAL_THIN_DIELECTRIC), transmission(transmission), transmissionFactor(log(transmission)*thickness), eta(eta), thickness(thickness) {}